

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

void CVmObjString::parse_num_val(vm_val_t *retval,char *str,size_t len,int radix,int int_only)

{
  wchar_t wVar1;
  uint uVar2;
  wchar_t wVar3;
  vm_obj_id_t vVar4;
  vm_datatype_t vVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  vm_obj_id_t vVar9;
  ulong uVar10;
  byte *p;
  byte *p_00;
  byte *pbVar11;
  byte *pbVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  ulong local_38;
  
  bVar13 = len == 0;
  p_00 = (byte *)str;
  pbVar12 = (byte *)len;
  if (!bVar13) {
    wVar1 = utf8_ptr::s_getch(str);
    uVar2 = t3_get_chartype(wVar1);
    while ((uVar2 & 0xfffffffe) == 6) {
      pbVar11 = p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) + 1;
      pbVar12 = p_00 + ((long)pbVar12 - (long)pbVar11);
      bVar13 = pbVar12 == (byte *)0x0;
      p_00 = pbVar11;
      if (bVar13) goto LAB_0028ab77;
      wVar1 = utf8_ptr::s_getch((char *)pbVar11);
      uVar2 = t3_get_chartype(wVar1);
    }
    if (!bVar13) {
      wVar1 = utf8_ptr::s_getch((char *)p_00);
      bVar13 = wVar1 != L'-';
      if ((wVar1 == L'-') || (wVar3 = utf8_ptr::s_getch((char *)p_00), wVar3 == L'+')) {
        bVar14 = wVar1 == L'-';
        pbVar12 = p_00 + ((long)pbVar12 -
                         (long)(p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3)
                                       + 1));
        p_00 = p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) + 1;
      }
      else {
        bVar14 = false;
        bVar13 = true;
      }
      goto joined_r0x0028abe1;
    }
  }
LAB_0028ab77:
  bVar14 = false;
  bVar13 = true;
joined_r0x0028abe1:
  while (pbVar12 != (byte *)0x0) {
    wVar1 = utf8_ptr::s_getch((char *)p_00);
    uVar2 = t3_get_chartype(wVar1);
    if ((uVar2 & 0xfffffffe) != 6) break;
    pbVar12 = p_00 + ((long)pbVar12 -
                     (long)(p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) + 1
                           ));
    p_00 = p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) + 1;
  }
  uVar10 = 0;
  if (pbVar12 != (byte *)0x0) {
    local_38 = 0x80000000;
    do {
      wVar1 = utf8_ptr::s_getch((char *)p_00);
      if (radix == 10 && int_only == 0) {
        if (wVar1 != L'.') {
          if ((wVar1 == L'e') || (wVar1 == L'E')) {
            pbVar11 = p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) + 1;
            wVar3 = utf8_ptr::s_getch((char *)pbVar11);
            if ((wVar3 == L'+') || (wVar3 = utf8_ptr::s_getch((char *)pbVar11), wVar3 == L'-')) {
              bVar15 = pbVar11 + (long)pbVar12 ==
                       pbVar11 + (ulong)(((*pbVar11 >> 5 & 1) != 0) + 1 & (uint)(*pbVar11 >> 7) * 3)
                                 + 1;
              p = pbVar11 + (ulong)(((*pbVar11 >> 5 & 1) != 0) + 1 & (uint)(*pbVar11 >> 7) * 3) + 1;
            }
            else {
              bVar15 = false;
              p = pbVar11;
            }
            pbVar12 = p_00 + ((long)pbVar12 - (long)pbVar11);
            if ((!bVar15) &&
               (wVar3 = utf8_ptr::s_getch((char *)p), 0xfffffff5 < (uint)(wVar3 + L'\xffffffc6')))
            goto LAB_0028adcf;
          }
          goto LAB_0028ac70;
        }
LAB_0028adcf:
        vVar4 = CVmObjBigNum::create_radix(0,str,len,10);
        retval->typ = VM_OBJ;
        (retval->val).obj = vVar4;
        iVar8 = 1;
      }
      else {
LAB_0028ac70:
        uVar2 = wVar1 + L'\xffffffd0';
        if (9 < uVar2) {
          if ((uint)(wVar1 + L'\xffffff9f') < 0x1a) {
            uVar2 = wVar1 + L'\xffffffa9';
          }
          else {
            iVar8 = 8;
            if (0x19 < (uint)(wVar1 + L'\xffffffbf')) goto LAB_0028adf8;
            uVar2 = wVar1 + L'\xffffffc9';
          }
        }
        iVar8 = 8;
        if ((int)uVar2 < radix) {
          uVar6 = local_38;
          if ((bVar13) &&
             ((0x10 < (uint)radix || (uVar6 = 0xffffffff, (0x10104U >> (radix & 0x1fU) & 1) == 0))))
          {
            uVar6 = 0x7fffffff;
          }
          iVar8 = 0xb;
          if (uVar10 <= uVar6 / (uint)radix) {
            uVar10 = uVar10 * (uint)radix;
            uVar6 = uVar6 - uVar2;
            bVar15 = uVar10 - uVar6 == 0;
            uVar7 = 0;
            if (uVar10 < uVar6 || bVar15) {
              uVar7 = (ulong)uVar2;
            }
            iVar8 = 0;
            if (uVar10 >= uVar6 && !bVar15) {
              iVar8 = 0xb;
            }
            uVar10 = uVar10 + uVar7;
          }
        }
      }
LAB_0028adf8:
      if (iVar8 != 0) {
        if (iVar8 != 8) {
          if (iVar8 != 0xb) {
            return;
          }
          if (int_only != 0) {
            err_throw(0x7e7);
          }
          vVar4 = CVmObjBigNum::create_radix(0,str,len,radix);
          vVar5 = VM_OBJ;
          goto LAB_0028ae7d;
        }
        break;
      }
      pbVar12 = p_00 + ((long)pbVar12 -
                       (long)(p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) +
                                     1));
      p_00 = p_00 + (ulong)(((*p_00 >> 5 & 1) != 0) + 1 & (uint)(*p_00 >> 7) * 3) + 1;
    } while (pbVar12 != (byte *)0x0);
  }
  vVar9 = (vm_obj_id_t)uVar10;
  vVar4 = -vVar9;
  if (0x7fffffff < uVar10) {
    vVar4 = vVar9;
  }
  if (!bVar14) {
    vVar4 = vVar9;
  }
  vVar5 = VM_INT;
LAB_0028ae7d:
  retval->typ = vVar5;
  (retval->val).obj = vVar4;
  return;
}

Assistant:

void CVmObjString::parse_num_val(VMG_ vm_val_t *retval,
                                 const char *str, size_t len,
                                 int radix, int int_only)
{
    utf8_ptr p;
    size_t rem;

    /* skip leading spaces */
    for (p.set((char *)str), rem = len ;
         rem != 0 && t3_is_whitespace(p.getch()) ; p.inc(&rem)) ;
    
    /* presume it's positive */
    int is_neg = FALSE;
    
    /* check for a leading + or - */
    if (rem != 0)
    {
        if (p.getch() == '-')
        {
            /* note the sign and skip the character */
            is_neg = TRUE;
            p.inc(&rem);
        }
        else if (p.getch() == '+')
        {
            /* skip the character */
            p.inc(&rem);
        }
    }

    /* skip any additional spaces after the sign */
    for ( ; rem != 0 && t3_is_whitespace(p.getch()) ; p.inc(&rem)) ;
    
    /* clear the accumulator */
    unsigned long acc = 0;
    
    /* scan the digits */
    for ( ; rem != 0 ; p.inc(&rem))
    {
        /* get the next digit */
        wchar_t ch = p.getch();

        /* 
         *   If we're allowed to promote to BigNumber, and the radix is
         *   decimal, check for '.' and 'E' (for exponent) notation.  These
         *   could indicate a floating point value.  
         */
        if (radix == 10 && !int_only && (ch == '.' || ch == 'e' || ch == 'E'))
        {
            /* presume we're going to promote to BigNumber */
            int promote = TRUE;
            
            /* 
             *   If it's an exponent, parse further to make sure it looks
             *   like a valid exponent: we can have an optional + or - sign,
             *   then need at least one digit.  
             */
            if (ch == 'e' || ch == 'E')
            {
                /* set up a second pointer */
                utf8_ptr p2(p);
                size_t rem2 = rem;

                /* skip the 'e' */
                p2.inc(&rem);

                /* if there's a sign, skip it */
                if (rem2 != 0 && (p2.getch() == '+' || p2.getch() == '-'))
                    p2.inc(&rem2);

                /* we need a digit at this point, or it's not an exponent */
                promote = (rem2 != 0 && is_digit(p2.getch()));
            }

            /* if we're promoting after all, go do the promotion */
            if (promote)
            {
                /* re-parse it as a BigNumber value */
                retval->set_obj(CVmObjBigNum::create_radix(
                    vmg_ FALSE, str, len, radix));

                /* return this value */
                return;
            }
        }

        /* get the integer value of the digit, treating A-Z as digits 10-35 */
        int dig;
        if (ch >= '0' && ch <= '9')
            dig = (int)(ch - '0');
        else if (ch >= 'a' && ch <= 'z')
            dig = (int)(ch - 'a' + 10);
        else if (ch >= 'A' && ch <= 'Z')
            dig = (int)(ch - 'A' + 10);
        else
            break;

        /* if it's outside the radix limit, it's not a digit after all */
        if (dig >= radix)
            break;

        /* 
         *   Make sure we're not going to overflow.  If the base is 2, 8, or
         *   16, and there wasn't a "-" sign, allow the value to go up to the
         *   unsigned 32-bit limit, 0xffffffff.  Otherwise, limit it to
         *   32-bit signed, -0x8000000 to +0x7ffffff.  
         */
        unsigned long limit =
            (!is_neg && (radix == 2 || radix == 8 || radix == 16))
            ? 0xffffffff
            : is_neg ? 0x80000000 : 0x7fffffff;
        
        /* shift the accumulator by the radix, checking for overflow */
        if (acc > limit/radix)
            goto overflow;
        acc *= radix;

        /* add the digit, checking for overflow */
        if (acc > limit - dig)
            goto overflow;
        acc += dig;
    }
    
    /* apply the sign, if appropriate, and set the return value */
    retval->set_int(is_neg && acc <= 0x7FFFFFFF ? -(long)acc : (long)acc);
    return;

overflow:
    /*
     *   We overflowed the plain integer type.  If we're allowed to promote
     *   to a BigNumber, re-parse the value as a BigNumber.  If not, it's an
     *   error.
     */
    if (int_only)
    {
        /* we can't promote to BigNumber - throw an overflow error */
        err_throw(VMERR_NUM_OVERFLOW);
    }
    else
    {
        /* re-parse it as a BigNumber value */
        retval->set_obj(CVmObjBigNum::create_radix(
            vmg_ FALSE, str, len, radix));
    }
}